

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.hpp
# Opt level: O0

void __thiscall cali::util::spinlock::unlock(spinlock *this)

{
  spinlock *this_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  (this->m_lock).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void unlock() { m_lock.clear(std::memory_order_release); }